

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

bool FastPForLib::Simple16<true>::tryme<3u,6u,2u,5u>(uint32_t *n,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = true;
  sVar1 = 3;
  if (len < 3) {
    sVar1 = len;
  }
  if (len != 0) {
    sVar2 = 0;
    do {
      if (0x3f < n[sVar2]) {
        return false;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    if (3 < len) {
      uVar3 = 2;
      if (len - sVar1 < 2) {
        uVar3 = len - sVar1;
      }
      lVar4 = 0;
      do {
        bVar5 = n[sVar1 + lVar4] < 0x20;
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = uVar3 - 1 != lVar4;
        lVar4 = lVar4 + 1;
      } while (bVar6);
    }
  }
  return bVar5;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }